

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
* __thiscall
EOPlus::Parser::ParseStateBlock_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
           *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Parser_Token_Server_Base *pPVar2;
  bool bVar3;
  int iVar4;
  runtime_error *prVar5;
  long *plVar6;
  size_type *psVar7;
  Token *t_00;
  Token *t_01;
  int iVar8;
  bool has_desc;
  string name;
  Token t;
  State state;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  string local_2d8;
  _Any_data local_2b8;
  code *local_2a8;
  code *pcStack_2a0;
  undefined1 local_290 [24];
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  bool local_258;
  bool bStack_257;
  bool bStack_256;
  bool bStack_255;
  bool bStack_254;
  undefined3 uStack_253;
  var_type local_250;
  int local_248;
  _Any_data local_240;
  code *local_230;
  code *local_228;
  string local_220;
  State local_200;
  variant local_110;
  Token local_d0;
  Token local_80;
  
  util::variant::variant(&local_110);
  local_290._0_4_ = Invalid;
  local_290._8_4_ = local_110.val_int;
  local_290._12_4_ = local_110._4_4_;
  local_290._16_4_ = local_110.val_float._0_4_;
  local_290._20_4_ = local_110.val_float._4_4_;
  local_2e0 = &local_268;
  local_278._M_p = (pointer)local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,local_110.val_string._M_dataplus._M_p,
             local_110.val_string._M_dataplus._M_p + local_110.val_string._M_string_length);
  local_250 = local_110.type;
  local_258 = local_110.val_bool;
  bStack_257 = local_110.cache_val[0];
  bStack_256 = local_110.cache_val[1];
  bStack_255 = local_110.cache_val[2];
  bStack_254 = local_110.cache_val[3];
  uStack_253 = local_110._53_3_;
  local_248 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.val_string._M_dataplus._M_p != &local_110.val_string.field_2) {
    operator_delete(local_110.val_string._M_dataplus._M_p,
                    local_110.val_string.field_2._M_allocated_capacity + 1);
  }
  bVar3 = GetToken(this,(Token *)local_290,1);
  if (!bVar3) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x18);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_320,"Expected state-name after \'state\'.","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_320);
    local_300._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_300._M_dataplus._M_p == psVar7) {
      local_300.field_2._M_allocated_capacity = *psVar7;
      local_300.field_2._8_8_ = plVar6[3];
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    }
    else {
      local_300.field_2._M_allocated_capacity = *psVar7;
    }
    local_300._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    Parser_Token_Server_Base::RejectToken
              (&local_d0,
               (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
    token_got_string_abi_cxx11_(&local_2d8,(EOPlus *)&local_d0,t_01);
    std::operator+(&local_200.name,&local_300,&local_2d8);
    pPVar2 = (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
    iVar4 = pPVar2->line;
    iVar8 = pPVar2->reject_line;
    std::runtime_error::runtime_error(prVar5,(string *)&local_200);
    if (iVar8 < iVar4) {
      iVar8 = iVar4;
    }
    *(int *)(prVar5 + 0x10) = iVar8;
    *(undefined ***)prVar5 = &PTR__runtime_error_001d17c8;
    __cxa_throw(prVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
  }
  util::variant::GetString_abi_cxx11_(&local_300,(variant *)(local_290 + 8));
  bVar3 = GetToken(this,(Token *)local_290,0x40);
  if (bVar3) {
    util::variant::GetString_abi_cxx11_(&local_200.name,(variant *)(local_290 + 8));
    iVar4 = std::__cxx11::string::compare((char *)&local_200);
    paVar1 = &local_200.name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.name._M_dataplus._M_p,
                      local_200.name.field_2._M_allocated_capacity + 1);
    }
    if (iVar4 == 0) {
      local_320._M_dataplus._M_p = local_320._M_dataplus._M_p & 0xffffffffffffff00;
      State::State(&local_200);
      local_2a8 = (code *)0x0;
      pcStack_2a0 = (code *)0x0;
      local_2b8._M_unused._M_object = (void *)0x0;
      local_2b8._8_8_ = 0;
      local_2b8._M_unused._M_object = operator_new(0x18);
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
       local_2b8._M_unused._0_8_ = &local_320;
      *(Parser **)((long)local_2b8._M_unused._0_8_ + 8) = this;
      *(State **)((long)local_2b8._M_unused._0_8_ + 0x10) = &local_200;
      pcStack_2a0 = std::
                    _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:450:54)>
                    ::_M_invoke;
      local_2a8 = std::
                  _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:450:54)>
                  ::_M_manager;
      local_228 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:473:5)>
                  ::_M_invoke;
      local_230 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:473:5)>
                  ::_M_manager;
      local_240._M_unused._M_object = &local_300;
      local_240._8_8_ = this;
      ParseRuleActionBlock
                (this,&local_200.rules,&local_200.actions,
                 (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_2b8,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_240);
      if (local_230 != (code *)0x0) {
        (*local_230)(&local_240,&local_240,__destroy_functor);
      }
      if (local_2a8 != (code *)0x0) {
        (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
      }
      std::__cxx11::string::_M_assign((string *)&local_200);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_EOPlus::State_&,_true>
                (__return_storage_ptr__,&local_300,&local_200);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::~deque(&local_200.actions);
      std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::~deque(&local_200.rules);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200.desc._M_dataplus._M_p != &local_200.desc.field_2) {
        operator_delete(local_200.desc._M_dataplus._M_p,
                        local_200.desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_200.name._M_dataplus._M_p,
                        local_200.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x18);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,"Expected opening brace \'{\' after state-name.","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_320._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_320._M_dataplus._M_p == psVar7) {
    local_320.field_2._M_allocated_capacity = *psVar7;
    local_320.field_2._8_8_ = plVar6[3];
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar7;
  }
  local_320._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Parser_Token_Server_Base::RejectToken
            (&local_80,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
  token_got_string_abi_cxx11_(&local_220,(EOPlus *)&local_80,t_00);
  std::operator+(&local_200.name,&local_320,&local_220);
  pPVar2 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  iVar4 = pPVar2->line;
  iVar8 = pPVar2->reject_line;
  std::runtime_error::runtime_error(prVar5,(string *)&local_200);
  if (iVar8 < iVar4) {
    iVar8 = iVar4;
  }
  *(int *)(prVar5 + 0x10) = iVar8;
  *(undefined ***)prVar5 = &PTR__runtime_error_001d17c8;
  __cxa_throw(prVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<std::string, State> Parser::ParseStateBlock()
	{
		Token t;

		if (this->GetToken(t, Token::Identifier))
		{
			std::string name = t.data;

			if (this->GetToken(t, Token::Symbol) && std::string(t.data) == "{")
			{
				bool has_desc = false;
				State state;

				ParseRuleActionBlock(state.rules, state.actions, [&](std::string entry) -> bool
				{
					if (entry == "desc")
					{
						if (has_desc)
							PARSER_ERROR("State can only contain one description.");

						has_desc = true;
						state.desc = this->ParseDesc();
						return true;
					}
					else if (entry == "goal")
					{
						Rule rule = this->ParseRule();
						state.rules.push_back(rule);
						state.goal_rule = state.rules.size() - 1;
						return true;
					}
					else
					{
						return false;
					}
				},
				[&](std::string expected)
				{
					PARSER_ERROR_GOT("Expected state-block entry (" + expected + "/goal/desc) or closing brace '}' in state '" + name + "'.");
				});

				state.name = name;
				return std::pair<std::string, State>(name, state);
			}

			PARSER_ERROR_GOT("Expected opening brace '{' after state-name.");
		}

		PARSER_ERROR_GOT("Expected state-name after 'state'.");
	}